

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

void google::protobuf::io::Tokenizer::ParseStringAppend(string *text,string *output)

{
  char cVar1;
  byte digit;
  uint32_t uVar2;
  bool bVar3;
  LogMessage *pLVar4;
  pointer pcVar5;
  pointer pcVar6;
  char *pcVar7;
  uint uVar8;
  uint32 x;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lStack_a0;
  LogFinisher local_89;
  uint32_t unicode;
  LogMessage local_68;
  
  if (text->_M_string_length == 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/tokenizer.cc"
               ,0x446);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_68,
                        " Tokenizer::ParseStringAppend() passed text that could not have been tokenized as a string: "
                       );
    CEscape((string *)&unicode,text);
    pLVar4 = internal::LogMessage::operator<<(pLVar4,(string *)&unicode);
    internal::LogFinisher::operator=(&local_89,pLVar4);
    std::__cxx11::string::~string((string *)&unicode);
    internal::LogMessage::~LogMessage(&local_68);
    return;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(output->_M_dataplus)._M_p == &output->field_2) {
    uVar9 = 0xf;
  }
  else {
    uVar9 = (output->field_2)._M_allocated_capacity;
  }
  if (uVar9 < text->_M_string_length + output->_M_string_length) {
    std::__cxx11::string::reserve((ulong)output);
  }
  pcVar6 = (text->_M_dataplus)._M_p;
LAB_003a0ab0:
  cVar1 = pcVar6[1];
  if (cVar1 == '\\') {
    digit = pcVar6[2];
    if (digit == 0) goto LAB_003a0b27;
    pcVar5 = pcVar6 + 2;
    if ((digit & 0xf8) == 0x30) {
      anon_unknown_4::DigitValue(digit);
      if ((pcVar6[3] & 0xf8U) == 0x30) {
        pcVar5 = pcVar6 + 3;
        anon_unknown_4::DigitValue(pcVar6[3]);
      }
      if ((pcVar5[1] & 0xf8U) == 0x30) {
        anon_unknown_4::DigitValue(pcVar5[1]);
        pcVar5 = pcVar5 + 1;
      }
    }
    else {
      switch(digit) {
      case 0x6e:
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x77:
switchD_003a0ba7_caseD_6f:
        break;
      case 0x72:
        break;
      case 0x74:
        break;
      case 0x75:
switchD_003a0ba7_caseD_75:
        uVar9 = (ulong)(digit == 0x55) << 3;
        if (digit == 0x75) {
          uVar9 = 4;
        }
        bVar3 = ReadHexDigits(pcVar6 + 3,(int)uVar9,&unicode);
        uVar2 = unicode;
        if (bVar3) {
          uVar11 = uVar9 | 3;
          uVar10 = (ulong)unicode;
          if ((unicode & 0xfffffc00) == 0xd800) {
            pcVar7 = pcVar6 + uVar9 + 3;
            if (((*pcVar7 == '\\') && (pcVar7[1] == 'u')) &&
               ((bVar3 = ReadHexDigits(pcVar7 + 2,4,&local_68.level_), bVar3 &&
                ((local_68.level_ & 0xfffffc00) == 0xdc00)))) {
              unicode = uVar2 * 0x400 + local_68.level_ + 0xfca02400;
              uVar10 = (ulong)unicode;
              uVar11 = uVar9 + 9;
            }
            pcVar6 = pcVar6 + uVar11;
LAB_003a0c64:
            uVar8 = (uint)uVar10;
            if (uVar8 < 0x10000) {
              lStack_a0 = 3;
              x = (uVar8 & 0xf000) * 0x10 + (uVar8 & 0x3f) + (uVar8 & 0xfc0) * 4 + 0xe08080;
              goto LAB_003a0d97;
            }
            if (uVar8 < 0x110000) {
              lStack_a0 = 4;
              x = (uVar8 & 0x3f | (uVar8 & 0x3f000) << 4 | (uVar8 & 0x1c0000) << 6) +
                  (uVar8 & 0xfc0) * 4 + 0xf0808080;
              goto LAB_003a0d97;
            }
            StringAppendF(output,"\\U%08x",uVar10);
          }
          else {
            pcVar6 = pcVar6 + uVar11;
            if (unicode < 0x80) {
              lStack_a0 = 1;
              x = unicode;
            }
            else {
              if (0x7ff < unicode) goto LAB_003a0c64;
              x = (unicode & 0x3f) + (unicode & 0x7c0) * 4 + 0xc080;
              lStack_a0 = 2;
            }
LAB_003a0d97:
            local_68.level_ = ghtonl(x);
            std::__cxx11::string::append((char *)output,(long)&local_68 + (4 - lStack_a0));
          }
          pcVar6 = pcVar6 + -1;
          goto LAB_003a0ab0;
        }
        break;
      case 0x76:
        break;
      case 0x78:
        cVar1 = pcVar6[3];
        bVar3 = anon_unknown_4::HexDigit::InClass(cVar1);
        if (bVar3) {
          pcVar5 = pcVar6 + 3;
          anon_unknown_4::DigitValue(cVar1);
        }
        cVar1 = pcVar5[1];
        bVar3 = anon_unknown_4::HexDigit::InClass(cVar1);
        if (bVar3) {
          anon_unknown_4::DigitValue(cVar1);
          pcVar5 = pcVar5 + 1;
        }
        break;
      default:
        if (((digit != 0x22) && (digit != 0x27)) && (digit != 0x3f)) {
          if (digit == 0x55) goto switchD_003a0ba7_caseD_75;
          if (((digit != 0x5c) && (digit != 0x61)) && ((digit != 0x62 && (digit != 0x66))))
          goto switchD_003a0ba7_caseD_6f;
        }
      }
    }
  }
  else {
    if (cVar1 == '\0') {
      return;
    }
LAB_003a0b27:
    pcVar5 = pcVar6 + 1;
    if ((cVar1 == *(text->_M_dataplus)._M_p) &&
       (pcVar7 = pcVar6 + 2, pcVar6 = pcVar5, *pcVar7 == '\0')) goto LAB_003a0ab0;
  }
  pcVar6 = pcVar5;
  std::__cxx11::string::push_back((char)output);
  goto LAB_003a0ab0;
}

Assistant:

void Tokenizer::ParseStringAppend(const std::string& text,
                                  std::string* output) {
  // Reminder: text[0] is always a quote character.  (If text is
  // empty, it's invalid, so we'll just return).
  const size_t text_size = text.size();
  if (text_size == 0) {
    GOOGLE_LOG(DFATAL) << " Tokenizer::ParseStringAppend() passed text that could not"
                   " have been tokenized as a string: "
                << CEscape(text);
    return;
  }

  // Reserve room for new string. The branch is necessary because if
  // there is already space available the reserve() call might
  // downsize the output.
  const size_t new_len = text_size + output->size();
  if (new_len > output->capacity()) {
    output->reserve(new_len);
  }

  // Loop through the string copying characters to "output" and
  // interpreting escape sequences.  Note that any invalid escape
  // sequences or other errors were already reported while tokenizing.
  // In this case we do not need to produce valid results.
  for (const char* ptr = text.c_str() + 1; *ptr != '\0'; ptr++) {
    if (*ptr == '\\' && ptr[1] != '\0') {
      // An escape sequence.
      ++ptr;

      if (OctalDigit::InClass(*ptr)) {
        // An octal escape.  May one, two, or three digits.
        int code = DigitValue(*ptr);
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'x') {
        // A hex escape.  May zero, one, or two digits.  (The zero case
        // will have been caught as an error earlier.)
        int code = 0;
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = DigitValue(*ptr);
        }
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 16 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'u' || *ptr == 'U') {
        uint32_t unicode;
        const char* end = FetchUnicodePoint(ptr, &unicode);
        if (end == ptr) {
          // Failure: Just dump out what we saw, don't try to parse it.
          output->push_back(*ptr);
        } else {
          AppendUTF8(unicode, output);
          ptr = end - 1;  // Because we're about to ++ptr.
        }
      } else {
        // Some other escape code.
        output->push_back(TranslateEscape(*ptr));
      }

    } else if (*ptr == text[0] && ptr[1] == '\0') {
      // Ignore final quote matching the starting quote.
    } else {
      output->push_back(*ptr);
    }
  }
}